

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

int Bac_ManAssignCountNames(Bac_Ntk_t *p)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  lVar6 = (long)(p->vInputs).nSize;
  if (lVar6 < 1) {
    iVar5 = 0;
  }
  else {
    lVar8 = 0;
    iVar5 = 0;
    do {
      iVar3 = (p->vInputs).pArray[lVar8];
      lVar10 = (long)iVar3;
      if ((lVar10 < 0) || ((p->vType).nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar2 = (p->vType).pArray[lVar10];
      if (0xffffffbb < (bVar2 >> 1) - 0x49) {
        __assert_fail("!Bac_ObjIsBox(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x11b,"int Bac_ObjBit(Bac_Ntk_t *, int)");
      }
      if ((char)bVar2 < '\0') {
LAB_003b3de1:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((bVar2 & 1) == 0) {
        if ((bVar2 & 0x7c) == 4) {
          __assert_fail("!Bac_ObjIsCo(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x11f,"int Bac_ObjNameInt(Bac_Ntk_t *, int)");
        }
        if ((p->vName).nSize <= iVar3) {
LAB_003b3e00:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = iVar5 + (uint)((p->vName).pArray[lVar10] == 0);
      }
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  uVar7 = (ulong)(p->vType).nSize;
  if (0 < (long)uVar7) {
    pcVar4 = (p->vType).pArray;
    uVar9 = 1;
    uVar11 = 0;
    do {
      pbVar1 = (byte *)(pcVar4 + uVar11);
      uVar11 = uVar11 + 1;
      uVar12 = uVar9;
      if (uVar11 < uVar7 && (*pbVar1 >> 1) - 5 < 0x44) {
        do {
          bVar2 = pcVar4[uVar12];
          if ((bVar2 & 0xfe) != 8) break;
          if ((char)bVar2 < '\0') goto LAB_003b3de1;
          if ((bVar2 & 1) == 0) {
            if ((long)(p->vName).nSize <= (long)uVar12) goto LAB_003b3e00;
            iVar5 = iVar5 + (uint)((p->vName).pArray[uVar12] == 0);
          }
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
      }
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar7);
  }
  return iVar5;
}

Assistant:

int Bac_ManAssignCountNames( Bac_Ntk_t * p )
{
    int i, iObj, iBox, Count = 0;
    Bac_NtkForEachPiMain( p, iObj, i )
        if ( !Bac_ObjNameInt(p, iObj) )
            Count++;
    Bac_NtkForEachBox( p, iBox )
        Bac_BoxForEachBoMain( p, iBox, iObj, i )
            if ( !Bac_ObjNameInt(p, iObj) )
                Count++;
    return Count;
}